

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindDecimalModulo<duckdb::ModuloOperator>
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  pointer pLVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer pDVar5;
  LogicalType *arg;
  pointer pLVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
  bind_data;
  _Any_data local_70;
  undefined8 uStack_60;
  undefined8 local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  BindDecimalArithmetic<true>((duckdb *)&local_50,context,bound_function,arguments);
  pDVar5 = unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
           ::operator->((unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
                         *)&local_50);
  if (pDVar5->check_overflow == true) {
    pLVar6 = (bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
    pLVar1 = *(pointer *)
              ((long)&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data + 8);
    if (pLVar6 != pLVar1) {
      do {
        LogicalType::LogicalType((LogicalType *)&local_70,DOUBLE);
        p_Var4 = uStack_60;
        uVar3 = local_70._8_8_;
        pLVar6->id_ = local_70._M_pod_data[0];
        pLVar6->physical_type_ = local_70._M_pod_data[1];
        uVar7 = *(undefined4 *)
                 &(pLVar6->type_info_).internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar8 = *(undefined4 *)
                 ((long)&(pLVar6->type_info_).internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr + 4);
        uVar9 = *(undefined4 *)
                 &(pLVar6->type_info_).internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        uVar10 = *(undefined4 *)
                  ((long)&(pLVar6->type_info_).internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 4);
        (pLVar6->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (pLVar6->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_70._8_8_ = 0;
        uStack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var2 = (pLVar6->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (pLVar6->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)uVar3;
        (pLVar6->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var4;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_48 = uVar7;
          uStack_44 = uVar8;
          uStack_40 = uVar9;
          uStack_3c = uVar10;
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          uVar7 = local_48;
          uVar8 = uStack_44;
          uVar9 = uStack_40;
          uVar10 = uStack_3c;
        }
        p_Var2 = uStack_60;
        local_70._12_4_ = uVar8;
        local_70._8_4_ = uVar7;
        uStack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uVar10,uVar9);
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        LogicalType::~LogicalType((LogicalType *)&local_70);
        pLVar6 = pLVar6 + 1;
      } while (pLVar6 != pLVar1);
    }
    LogicalType::LogicalType((LogicalType *)&local_70,DOUBLE);
    p_Var4 = uStack_60;
    uVar3 = local_70._8_8_;
    (bound_function->super_BaseScalarFunction).return_type.id_ = local_70._M_pod_data[0];
    (bound_function->super_BaseScalarFunction).return_type.physical_type_ = local_70._M_pod_data[1];
    uVar7 = *(undefined4 *)
             &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar8 = *(undefined4 *)
             ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
             4);
    uVar9 = *(undefined4 *)
             &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    uVar10 = *(undefined4 *)
              ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_70._8_8_ = 0;
    uStack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar3;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var4
    ;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_48 = uVar7;
      uStack_44 = uVar8;
      uStack_40 = uVar9;
      uStack_3c = uVar10;
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      uVar7 = local_48;
      uVar8 = uStack_44;
      uVar9 = uStack_40;
      uVar10 = uStack_3c;
    }
    p_Var2 = uStack_60;
    local_70._12_4_ = uVar8;
    local_70._8_4_ = uVar7;
    uStack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uVar10,uVar9);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    LogicalType::~LogicalType((LogicalType *)&local_70);
  }
  GetBinaryFunctionIgnoreZero<duckdb::ModuloOperator>
            ((scalar_function_t *)&local_70,
             (bound_function->super_BaseScalarFunction).return_type.physical_type_);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  operator=(&bound_function->function,
            (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            &local_70);
  if (uStack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(code *)uStack_60)(&local_70,&local_70,3);
  }
  *(undefined8 *)this = local_50;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> BindDecimalModulo(ClientContext &context, ScalarFunction &bound_function,
                                           vector<unique_ptr<Expression>> &arguments) {
	auto bind_data = BindDecimalArithmetic<true>(context, bound_function, arguments);
	// now select the physical function to execute
	if (bind_data->check_overflow) {
		// fallback to DOUBLE if the decimal type is not guaranteed to fit within the max decimal width
		for (auto &arg : bound_function.arguments) {
			arg = LogicalType::DOUBLE;
		}
		bound_function.return_type = LogicalType::DOUBLE;
	}
	auto &result_type = bound_function.return_type;
	bound_function.function = GetBinaryFunctionIgnoreZero<OP>(result_type.InternalType());
	return std::move(bind_data);
}